

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void cppforth::Forth::skipDecimalDigits
               (const_iterator beginIt,const_iterator endIt,const_iterator *it)

{
  char cVar1;
  
  do {
    it->_M_current = (char *)beginIt;
    if (endIt._M_current <= beginIt._M_current) {
      return;
    }
    cVar1 = *beginIt._M_current;
    beginIt._M_current = beginIt._M_current + 1;
  } while ((byte)(cVar1 - 0x30U) < 10);
  return;
}

Assistant:

static void skipDecimalDigits(const std::string::const_iterator beginIt, const std::string::const_iterator endIt, 
				std::string::const_iterator &it) {
			it = beginIt;
			while (it < endIt) {
				auto c = (*it);
				if (c>='0' && c<='9') {
					++it;
				}
				else {
					break;
				}
			}
			return ;
		}